

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

ResumeThrow * __thiscall MixedArena::alloc<wasm::ResumeThrow>(MixedArena *this)

{
  ResumeThrow *this_00;
  
  this_00 = (ResumeThrow *)allocSpace(this,0xa8,8);
  ::wasm::ResumeThrow::ResumeThrow(this_00,this);
  return this_00;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }